

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ikfast.h
# Opt level: O0

IkSolutionBase<double> * __thiscall
ikfast::IkSolutionList<double>::GetSolution(IkSolutionList<double> *this,size_t index)

{
  size_type sVar1;
  runtime_error *this_00;
  reference pIVar2;
  _List_const_iterator<ikfast::IkSolution<double>_> local_30;
  const_iterator it;
  size_t index_local;
  IkSolutionList<double> *this_local;
  
  sVar1 = std::__cxx11::
          list<ikfast::IkSolution<double>,_std::allocator<ikfast::IkSolution<double>_>_>::size
                    (&this->_listsolutions);
  if (sVar1 <= index) {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,"GetSolution index is invalid");
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  local_30._M_node =
       (_List_node_base *)
       std::__cxx11::list<ikfast::IkSolution<double>,_std::allocator<ikfast::IkSolution<double>_>_>
       ::begin(&this->_listsolutions);
  std::advance<std::_List_const_iterator<ikfast::IkSolution<double>>,unsigned_long>(&local_30,index)
  ;
  pIVar2 = std::_List_const_iterator<ikfast::IkSolution<double>_>::operator*(&local_30);
  return &pIVar2->super_IkSolutionBase<double>;
}

Assistant:

virtual const IkSolutionBase<T>& GetSolution(size_t index) const
    {
        if( index >= _listsolutions.size() ) {
            throw std::runtime_error("GetSolution index is invalid");
        }
        typename std::list< IkSolution<T> >::const_iterator it = _listsolutions.begin();
        std::advance(it,index);
        return *it;
    }